

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_memory.c
# Opt level: O2

void * resizebytes(void *old,size_t oldsize,size_t newsize)

{
  void *pvVar1;
  size_t __size;
  ulong uVar2;
  
  __size = newsize + (newsize == 0);
  uVar2 = oldsize + (oldsize == 0);
  pvVar1 = realloc(old,__size);
  if (pvVar1 == (void *)0x0 || newsize <= uVar2) {
    if (pvVar1 == (void *)0x0) {
      post("pd: resizebytes() failed -- out of memory");
    }
  }
  else {
    memset((void *)((long)pvVar1 + uVar2),0,__size - uVar2);
  }
  return pvVar1;
}

Assistant:

void *resizebytes(void *old, size_t oldsize, size_t newsize)
{
    void *ret;
    if (newsize < 1) newsize = 1;
    if (oldsize < 1) oldsize = 1;
    ret = (void *)realloc((char *)old, newsize);
    if (newsize > oldsize && ret)
        memset(((char *)ret) + oldsize, 0, newsize - oldsize);
#ifdef LOUD
    fprintf(stderr, "resize %lx %d --> %lx %d\n", (int)old, oldsize, (int)ret, newsize);
#endif /* LOUD */
#ifdef DEBUGMEM
    totalmem += (newsize - oldsize);
#endif
    if (!ret)
        post("pd: resizebytes() failed -- out of memory");
    return (ret);
}